

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteString
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  LogMessage *other;
  byte *pbVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  uint uVar7;
  size_t __n;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar7 = field_number << 3;
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  *pbVar4 = (byte)uVar7 | 2;
  if (uVar7 < 0x80) {
    pbVar3 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar7 | 0x82;
    pbVar4[1] = (byte)(uVar7 >> 7);
    pbVar3 = pbVar4 + 2;
    if (0x3fff < uVar7) {
      uVar2 = (uint)pbVar4[1];
      uVar7 = uVar7 >> 7;
      do {
        pbVar3[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar7 >> 7;
        *pbVar3 = (byte)uVar2;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar3;
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1e5);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kInt32MaxSize): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  uVar6 = value->_M_string_length;
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  *pbVar4 = (byte)uVar6;
  if ((uint)uVar6 < 0x80) {
    pbVar3 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar6 | 0x80;
    uVar5 = uVar6 >> 7 & 0x1ffffff;
    pbVar4[1] = (byte)uVar5;
    pbVar3 = pbVar4 + 2;
    if (0x3fff < (uint)uVar6) {
      uVar6 = (ulong)pbVar4[1];
      do {
        pbVar3[-1] = (byte)uVar6 | 0x80;
        uVar6 = uVar5 >> 7;
        *pbVar3 = (byte)uVar6;
        pbVar3 = pbVar3 + 1;
        uVar7 = (uint)uVar5;
        uVar5 = uVar6;
      } while (0x3fff < uVar7);
    }
  }
  output->cur_ = pbVar3;
  data = (value->_M_dataplus)._M_p;
  size = (int)value->_M_string_length;
  __n = (size_t)size;
  if ((long)(output->impl_).end_ - (long)pbVar3 < (long)__n) {
    pbVar3 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,size,pbVar3);
  }
  else {
    memcpy(pbVar3,data,__n);
    pbVar3 = pbVar3 + __n;
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

void WireFormatLite::WriteString(int field_number, const std::string& value,
                                 io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}